

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

PyObject * libxml_saveNodeTo(PyObject *self,PyObject *args)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  FILE *f;
  long lVar4;
  undefined8 uVar5;
  PyObject *pPVar6;
  long lVar7;
  long lVar8;
  int format;
  char *encoding;
  PyObject *pyobj_node;
  PyObject *py_file;
  undefined4 local_44;
  long local_40;
  undefined *local_38;
  PyObject *local_30;
  
  local_30 = (PyObject *)0x0;
  iVar3 = _PyArg_ParseTuple_SizeT(args,"OOzi:serializeNode",&local_38,&local_30,&local_40,&local_44)
  ;
  if (iVar3 == 0) {
    return (PyObject *)0x0;
  }
  lVar7 = -1;
  if ((((local_38 == &_Py_NoneStruct) || (lVar2 = *(long *)(local_38 + 0x10), lVar2 == 0)) ||
      (local_30 == (PyObject *)&_Py_NoneStruct)) ||
     (f = libxml_PyFileGet(local_30), f == (FILE *)0x0)) goto LAB_0013da7d;
  uVar1 = *(uint *)(lVar2 + 8);
  lVar8 = lVar2;
  if ((uVar1 | 4) != 0xd) {
    lVar8 = *(long *)(lVar2 + 0x40);
    uVar1 = *(uint *)(lVar8 + 8);
  }
  if (local_40 == 0 && uVar1 == 0xd) {
    local_40 = htmlGetMetaEncoding(lVar8);
  }
  if (local_40 == 0) {
    if (*(int *)(lVar8 + 8) == 0xd) {
      lVar4 = xmlFindCharEncodingHandler("HTML");
      if (lVar4 == 0) {
        lVar4 = xmlFindCharEncodingHandler("ascii");
      }
    }
    else {
      lVar4 = 0;
    }
  }
  else {
    lVar4 = xmlFindCharEncodingHandler();
    if (lVar4 == 0) {
      libxml_PyFileRelease(f);
      goto LAB_0013da7d;
    }
  }
  uVar5 = xmlOutputBufferCreateFile(f,lVar4);
  if (*(int *)(lVar2 + 8) == 0xd) {
    htmlDocContentDumpFormatOutput(uVar5,lVar8,local_40,local_44);
LAB_0013da68:
    iVar3 = xmlOutputBufferClose(uVar5);
  }
  else {
    if (*(int *)(lVar2 + 8) != 9) {
      if (*(int *)(lVar8 + 8) == 0xd) {
        htmlNodeDumpFormatOutput(uVar5,lVar8,lVar2,local_40,local_44);
      }
      else {
        xmlNodeDumpOutput(uVar5,lVar8,lVar2,0,local_44,local_40);
      }
      goto LAB_0013da68;
    }
    iVar3 = xmlSaveFormatFileTo(uVar5,lVar8,local_40,local_44);
  }
  libxml_PyFileRelease(f);
  lVar7 = (long)iVar3;
LAB_0013da7d:
  pPVar6 = (PyObject *)PyLong_FromLong(lVar7);
  return pPVar6;
}

Assistant:

static PyObject *
libxml_saveNodeTo(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_file = NULL;
    FILE *output;
    PyObject *pyobj_node;
    xmlNodePtr node;
    xmlDocPtr doc;
    const char *encoding;
    int format;
    int len;
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;

    if (!PyArg_ParseTuple(args, (char *) "OOzi:serializeNode", &pyobj_node,
                          &py_file, &encoding, &format))
        return (NULL);
    node = (xmlNodePtr) PyxmlNode_Get(pyobj_node);
    if (node == NULL) {
        return (PyLong_FromLong((long) -1));
    }
    output = PyFile_Get(py_file);
    if (output == NULL) {
        return (PyLong_FromLong((long) -1));
    }

    if (node->type == XML_DOCUMENT_NODE) {
        doc = (xmlDocPtr) node;
    } else if (node->type == XML_HTML_DOCUMENT_NODE) {
        doc = (xmlDocPtr) node;
    } else {
        doc = node->doc;
    }
#ifdef LIBXML_HTML_ENABLED
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
        if (encoding == NULL)
            encoding = (const char *) htmlGetMetaEncoding(doc);
    }
#endif /* LIBXML_HTML_ENABLED */
    if (encoding != NULL) {
        handler = xmlFindCharEncodingHandler(encoding);
        if (handler == NULL) {
            PyFile_Release(output);
            return (PyLong_FromLong((long) -1));
        }
    }
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    buf = xmlOutputBufferCreateFile(output, handler);
    if (node->type == XML_DOCUMENT_NODE) {
        len = xmlSaveFormatFileTo(buf, doc, encoding, format);
#ifdef LIBXML_HTML_ENABLED
    } else if (node->type == XML_HTML_DOCUMENT_NODE) {
        htmlDocContentDumpFormatOutput(buf, doc, encoding, format);
        len = xmlOutputBufferClose(buf);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        htmlNodeDumpFormatOutput(buf, doc, node, encoding, format);
        len = xmlOutputBufferClose(buf);
#endif /* LIBXML_HTML_ENABLED */
    } else {
        xmlNodeDumpOutput(buf, doc, node, 0, format, encoding);
        len = xmlOutputBufferClose(buf);
    }
    PyFile_Release(output);
    return (PyLong_FromLong((long) len));
}